

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::
Span<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>::erase
          (Span<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
           *this,size_t bucket)

{
  byte bVar1;
  uchar uVar2;
  uchar *puVar3;
  long in_RSI;
  MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*> *in_RDI;
  uchar entry;
  
  bVar1 = *(byte *)((long)&(in_RDI->key).index.r + in_RSI);
  *(undefined1 *)((long)&(in_RDI->key).index.r + in_RSI) = 0xff;
  Entry::node((Entry *)(*(long *)&in_RDI[4].key.index + (ulong)bVar1 * 0x20));
  MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>::~MultiNode(in_RDI);
  uVar2 = *(uchar *)((long)&in_RDI[4].key.index.i + 1);
  puVar3 = Entry::nextFree((Entry *)(*(long *)&in_RDI[4].key.index + (ulong)bVar1 * 0x20));
  *puVar3 = uVar2;
  *(byte *)((long)&in_RDI[4].key.index.i + 1) = bVar1;
  return;
}

Assistant:

void erase(size_t bucket) noexcept(std::is_nothrow_destructible<Node>::value)
    {
        Q_ASSERT(bucket < SpanConstants::NEntries);
        Q_ASSERT(offsets[bucket] != SpanConstants::UnusedEntry);

        unsigned char entry = offsets[bucket];
        offsets[bucket] = SpanConstants::UnusedEntry;

        entries[entry].node().~Node();
        entries[entry].nextFree() = nextFree;
        nextFree = entry;
    }